

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

void pospopcnt_u8_avx512bw_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 auVar1 [16];
  __m512i x;
  __m512i x_00;
  __m512i x_01;
  __m512i x_02;
  __m512i x_03;
  __m512i x_04;
  __m512i x_05;
  __m512i x_06;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar36 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar39 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar40 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar41 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar42 [64];
  undefined4 in_stack_fffffffffffffde8;
  uint uVar43;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 uVar44;
  uint8_t *data_00;
  byte bVar45;
  undefined7 uVar46;
  
  auVar12 = vpbroadcastq_avx512f(ZEXT816(0x5555555555555555));
  auVar13 = vpbroadcastq_avx512f(ZEXT816(0xaaaaaaaaaaaaaaaa));
  auVar14 = vpbroadcastq_avx512f(ZEXT816(0x3333333333333333));
  auVar15 = vpbroadcastq_avx512f(ZEXT816(0xcccccccccccccccc));
  auVar16 = vpbroadcastb_avx512bw(ZEXT116(0xf));
  auVar17 = vbroadcasti32x4_avx512f(_DAT_00114170);
  uVar2 = len & 0xffffffffffffff00;
  auVar11 = vpxord_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
  auVar36 = ZEXT1664(auVar11);
  auVar28 = ZEXT1664((undefined1  [16])0x0);
  auVar29 = ZEXT1664((undefined1  [16])0x0);
  auVar30 = ZEXT1664((undefined1  [16])0x0);
  auVar31 = ZEXT1664((undefined1  [16])0x0);
  auVar32 = ZEXT1664((undefined1  [16])0x0);
  auVar33 = ZEXT1664((undefined1  [16])0x0);
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  auVar35 = ZEXT1664((undefined1  [16])0x0);
  auVar11 = vpxord_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
  auVar37 = ZEXT1664(auVar11);
  auVar11 = vpxord_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
  auVar38 = ZEXT1664(auVar11);
  auVar11 = vpxord_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
  auVar39 = ZEXT1664(auVar11);
  auVar11 = vpxord_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
  auVar40 = ZEXT1664(auVar11);
  auVar11 = vpxord_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
  auVar41 = ZEXT1664(auVar11);
  auVar11 = vpxord_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar42 = ZEXT1664(auVar11);
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  bVar45 = (byte)len;
  uVar46 = (undefined7)(len >> 8);
  data_00 = data + uVar2;
  iVar10 = 0;
  for (; uVar2 != 0; uVar2 = uVar2 - 0x100) {
    auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0xc0));
    auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0x40));
    auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0x80));
    auVar21 = vmovdqu64_avx512f(*(undefined1 (*) [64])data);
    iVar10 = iVar10 + 1;
    auVar22 = vpaddb_avx512bw(auVar18,auVar18);
    auVar18 = vpsrld_avx512f(auVar18,1);
    auVar23 = vpaddb_avx512bw(auVar19,auVar19);
    auVar19 = vpsrld_avx512f(auVar19,1);
    auVar18 = vpternlogq_avx512f(auVar18,auVar12,auVar20,0xe2);
    auVar20 = vpternlogq_avx512f(auVar22,auVar13,auVar20,0xe2);
    auVar22 = vpternlogq_avx512f(auVar23,auVar13,auVar21,0xe2);
    auVar19 = vpternlogq_avx512f(auVar19,auVar12,auVar21,0xe2);
    auVar21 = vpslld_avx512f(auVar18,2);
    auVar23 = vpslld_avx512f(auVar20,2);
    auVar20 = vpsrld_avx512f(auVar20,2);
    auVar18 = vpsrld_avx512f(auVar18,2);
    auVar20 = vpternlogq_avx512f(auVar20,auVar14,auVar22,0xe2);
    auVar18 = vpternlogq_avx512f(auVar18,auVar14,auVar19,0xe2);
    auVar22 = vpternlogq_avx512f(auVar23,auVar15,auVar22,0xe2);
    auVar19 = vpternlogq_avx512f(auVar21,auVar15,auVar19,0xe2);
    auVar21 = vpandq_avx512f(auVar22,auVar16);
    auVar23 = vpandq_avx512f(auVar19,auVar16);
    auVar24 = vpandq_avx512f(auVar20,auVar16);
    auVar25 = vpandq_avx512f(auVar18,auVar16);
    auVar22 = vpsrld_avx512f(auVar22,4);
    auVar19 = vpsrld_avx512f(auVar19,4);
    auVar20 = vpsrld_avx512f(auVar20,4);
    auVar18 = vpsrld_avx512f(auVar18,4);
    auVar22 = vpandq_avx512f(auVar22,auVar16);
    auVar19 = vpandq_avx512f(auVar19,auVar16);
    auVar20 = vpandq_avx512f(auVar20,auVar16);
    auVar18 = vpandq_avx512f(auVar18,auVar16);
    auVar21 = vpshufb_avx512bw(auVar17,auVar21);
    auVar23 = vpshufb_avx512bw(auVar17,auVar23);
    auVar24 = vpshufb_avx512bw(auVar17,auVar24);
    auVar25 = vpshufb_avx512bw(auVar17,auVar25);
    auVar22 = vpshufb_avx512bw(auVar17,auVar22);
    auVar19 = vpshufb_avx512bw(auVar17,auVar19);
    auVar20 = vpshufb_avx512bw(auVar17,auVar20);
    auVar18 = vpshufb_avx512bw(auVar17,auVar18);
    auVar35 = vpaddb_avx512bw(auVar21,auVar35);
    auVar34 = vpaddb_avx512bw(auVar23,auVar34);
    auVar33 = vpaddb_avx512bw(auVar24,auVar33);
    auVar32 = vpaddb_avx512bw(auVar25,auVar32);
    auVar31 = vpaddb_avx512bw(auVar22,auVar31);
    auVar30 = vpaddb_avx512bw(auVar19,auVar30);
    auVar29 = vpaddb_avx512bw(auVar20,auVar29);
    auVar28 = vpaddb_avx512bw(auVar18,auVar28);
    if (iVar10 == 0x3f) {
      auVar18 = ZEXT1664((undefined1  [16])0x0);
      iVar10 = 0;
      auVar35 = vpsadbw_avx512bw(auVar35,auVar18);
      auVar34 = vpsadbw_avx512bw(auVar34,auVar18);
      auVar33 = vpsadbw_avx512bw(auVar33,auVar18);
      auVar32 = vpsadbw_avx512bw(auVar32,auVar18);
      auVar31 = vpsadbw_avx512bw(auVar31,auVar18);
      auVar30 = vpsadbw_avx512bw(auVar30,auVar18);
      auVar29 = vpsadbw_avx512bw(auVar29,auVar18);
      auVar28 = vpsadbw_avx512bw(auVar28,auVar18);
      auVar27 = vpaddq_avx512f(auVar35,auVar27);
      auVar42 = vpaddq_avx512f(auVar34,auVar42);
      auVar41 = vpaddq_avx512f(auVar33,auVar41);
      auVar40 = vpaddq_avx512f(auVar32,auVar40);
      auVar39 = vpaddq_avx512f(auVar31,auVar39);
      auVar38 = vpaddq_avx512f(auVar30,auVar38);
      auVar37 = vpaddq_avx512f(auVar29,auVar37);
      auVar36 = vpaddq_avx512f(auVar28,auVar36);
      auVar28 = ZEXT1664((undefined1  [16])0x0);
      auVar29 = ZEXT1664((undefined1  [16])0x0);
      auVar30 = ZEXT1664((undefined1  [16])0x0);
      auVar31 = ZEXT1664((undefined1  [16])0x0);
      auVar32 = ZEXT1664((undefined1  [16])0x0);
      auVar33 = ZEXT1664((undefined1  [16])0x0);
      auVar34 = ZEXT1664((undefined1  [16])0x0);
      auVar35 = ZEXT1664((undefined1  [16])0x0);
    }
    data = (uint8_t *)((long)data + 0x100);
  }
  if (iVar10 == 0) {
    vmovdqu64_avx512f(auVar36);
    vmovdqu64_avx512f(auVar37);
    vmovdqu64_avx512f(auVar38);
    vmovdqu64_avx512f(auVar39);
    vmovdqu64_avx512f(auVar40);
    vmovdqu64_avx512f(auVar41);
    auVar12 = vmovdqu64_avx512f(auVar42);
    auVar26 = auVar12._0_32_;
  }
  else {
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar12 = vpsadbw_avx512bw(auVar34,auVar18);
    auVar13 = vpsadbw_avx512bw(auVar33,auVar18);
    auVar14 = vpsadbw_avx512bw(auVar35,auVar18);
    auVar15 = vpsadbw_avx512bw(auVar29,auVar18);
    auVar16 = vpsadbw_avx512bw(auVar28,auVar18);
    auVar12 = vpaddq_avx512f(auVar12,auVar42);
    auVar17 = vpsadbw_avx512bw(auVar32,auVar18);
    auVar13 = vpaddq_avx512f(auVar13,auVar41);
    auVar35 = vpsadbw_avx512bw(auVar31,auVar18);
    vpaddq_avx512f(auVar14,auVar27);
    auVar14 = vpaddq_avx512f(auVar15,auVar37);
    auVar15 = vpaddq_avx512f(auVar16,auVar36);
    auVar12 = vmovdqu64_avx512f(auVar12);
    auVar26 = auVar12._0_32_;
    vmovdqu64_avx512f(auVar13);
    auVar12 = vpaddq_avx512f(auVar17,auVar40);
    auVar13 = vpsadbw_avx512bw(auVar30,auVar18);
    auVar16 = vpaddq_avx512f(auVar35,auVar39);
    vmovdqu64_avx512f(auVar12);
    vmovdqu64_avx512f(auVar16);
    auVar12 = vpaddq_avx512f(auVar13,auVar38);
    vmovdqu64_avx512f(auVar12);
    vmovdqu64_avx512f(auVar14);
    vmovdqu64_avx512f(auVar15);
  }
  x[0]._4_4_ = in_stack_fffffffffffffdec;
  x[0]._0_4_ = in_stack_fffffffffffffde8;
  x[1] = (longlong)data_00;
  x[2]._0_1_ = bVar45;
  x[2]._1_7_ = uVar46;
  x[3] = (longlong)flag_counts;
  x[4] = auVar26._0_8_;
  x[5] = auVar26._8_8_;
  x[6] = auVar26._16_8_;
  x[7] = auVar26._24_8_;
  uVar3 = avx512_sum_epu64(x);
  uVar43 = (uint)uVar3;
  uVar44 = (undefined4)(uVar3 >> 0x20);
  x_00[1] = (longlong)data_00;
  x_00[0] = uVar3;
  x_00[2]._0_1_ = bVar45;
  x_00[2]._1_7_ = uVar46;
  x_00[3] = (longlong)flag_counts;
  x_00[4] = auVar26._0_8_;
  x_00[5] = auVar26._8_8_;
  x_00[6] = auVar26._16_8_;
  x_00[7] = auVar26._24_8_;
  uVar3 = avx512_sum_epu64(x_00);
  x_01[0]._4_4_ = uVar44;
  x_01[0]._0_4_ = uVar43;
  x_01[1] = (longlong)data_00;
  x_01[2]._0_1_ = bVar45;
  x_01[2]._1_7_ = uVar46;
  x_01[3] = (longlong)flag_counts;
  x_01[4] = auVar26._0_8_;
  x_01[5] = auVar26._8_8_;
  x_01[6] = auVar26._16_8_;
  x_01[7] = auVar26._24_8_;
  uVar4 = avx512_sum_epu64(x_01);
  x_02[0]._4_4_ = uVar44;
  x_02[0]._0_4_ = uVar43;
  x_02[1] = (longlong)data_00;
  x_02[2]._0_1_ = bVar45;
  x_02[2]._1_7_ = uVar46;
  x_02[3] = (longlong)flag_counts;
  x_02[4] = auVar26._0_8_;
  x_02[5] = auVar26._8_8_;
  x_02[6] = auVar26._16_8_;
  x_02[7] = auVar26._24_8_;
  uVar5 = avx512_sum_epu64(x_02);
  x_03[0]._4_4_ = uVar44;
  x_03[0]._0_4_ = uVar43;
  x_03[1] = (longlong)data_00;
  x_03[2]._0_1_ = bVar45;
  x_03[2]._1_7_ = uVar46;
  x_03[3] = (longlong)flag_counts;
  x_03[4] = auVar26._0_8_;
  x_03[5] = auVar26._8_8_;
  x_03[6] = auVar26._16_8_;
  x_03[7] = auVar26._24_8_;
  uVar6 = avx512_sum_epu64(x_03);
  x_04[0]._4_4_ = uVar44;
  x_04[0]._0_4_ = uVar43;
  x_04[1] = (longlong)data_00;
  x_04[2]._0_1_ = bVar45;
  x_04[2]._1_7_ = uVar46;
  x_04[3] = (longlong)flag_counts;
  x_04[4] = auVar26._0_8_;
  x_04[5] = auVar26._8_8_;
  x_04[6] = auVar26._16_8_;
  x_04[7] = auVar26._24_8_;
  uVar7 = avx512_sum_epu64(x_04);
  x_05[0]._4_4_ = uVar44;
  x_05[0]._0_4_ = uVar43;
  x_05[1] = (longlong)data_00;
  x_05[2]._0_1_ = bVar45;
  x_05[2]._1_7_ = uVar46;
  x_05[3] = (longlong)flag_counts;
  x_05[4] = auVar26._0_8_;
  x_05[5] = auVar26._8_8_;
  x_05[6] = auVar26._16_8_;
  x_05[7] = auVar26._24_8_;
  uVar8 = avx512_sum_epu64(x_05);
  x_06[0]._4_4_ = uVar44;
  x_06[0]._0_4_ = uVar43;
  x_06[1] = (longlong)data_00;
  x_06[2]._0_1_ = bVar45;
  x_06[2]._1_7_ = uVar46;
  x_06[3] = (longlong)flag_counts;
  x_06[4] = auVar26._0_8_;
  x_06[5] = auVar26._8_8_;
  x_06[6] = auVar26._16_8_;
  x_06[7] = auVar26._24_8_;
  uVar9 = avx512_sum_epu64(x_06);
  auVar11 = vpinsrd_avx(ZEXT416((uint)uVar6),(int)uVar7,1);
  auVar11 = vpinsrd_avx(auVar11,(int)uVar8,2);
  auVar11 = vpinsrd_avx(auVar11,(int)uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar43),(int)uVar3,1);
  auVar1 = vpinsrd_avx(auVar1,(int)uVar4,2);
  auVar1 = vpinsrd_avx(auVar1,(int)uVar5,3);
  auVar26._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar1;
  auVar26._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  auVar26 = vpaddd_avx2(auVar26,*(undefined1 (*) [32])flag_counts);
  *(undefined1 (*) [32])flag_counts = auVar26;
  pospopcnt_u8_scalar_naive(data_00,(ulong)bVar45,flag_counts);
  return;
}

Assistant:

void pospopcnt_u8_avx512bw_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m512i zero = _mm512_setzero_si512();

    __m512i counter_a = zero;
    __m512i counter_b = zero;
    __m512i counter_c = zero;
    __m512i counter_d = zero;
    __m512i counter_e = zero;
    __m512i counter_f = zero;
    __m512i counter_g = zero;
    __m512i counter_h = zero;

    const __m512i popcnt_4bit = _mm512_setr_epi64(
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu
    );

    const __m512i lo_nibble = _mm512_set1_epi8(0x0f);

    int local = 0;
    __m512i counter8bit_a = zero;
    __m512i counter8bit_b = zero;
    __m512i counter8bit_c = zero;
    __m512i counter8bit_d = zero;
    __m512i counter8bit_e = zero;
    __m512i counter8bit_f = zero;
    __m512i counter8bit_g = zero;
    __m512i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*64 - 1)]; data != end; data += 4*64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m512i r0 = _mm512_loadu_si512((__m512i*)&data[0*64]);
        const __m512i r1 = _mm512_loadu_si512((__m512i*)&data[1*64]);
        const __m512i r2 = _mm512_loadu_si512((__m512i*)&data[2*64]);
        const __m512i r3 = _mm512_loadu_si512((__m512i*)&data[3*64]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m512i s0 = avx512_merge1_even(r0, r1);
        const __m512i s1 = avx512_merge1_odd (r0, r1);
        const __m512i s2 = avx512_merge1_even(r2, r3);
        const __m512i s3 = avx512_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m512i d0 = avx512_merge2_even(s0, s2);
        const __m512i d1 = avx512_merge2_even(s1, s3);
        const __m512i d2 = avx512_merge2_odd (s0, s2);
        const __m512i d3 = avx512_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m512i popcnt_a = _mm512_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m512i popcnt_e = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d0, 4) & lo_nibble);
        const __m512i popcnt_b = _mm512_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m512i popcnt_f = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d1, 4) & lo_nibble);
        const __m512i popcnt_c = _mm512_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m512i popcnt_g = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d2, 4) & lo_nibble);
        const __m512i popcnt_d = _mm512_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m512i popcnt_h = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm512_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm512_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm512_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm512_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm512_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm512_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm512_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm512_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm512_setzero_si512();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx512_sum_epu64(counter_a);
    flag_counts[1] += avx512_sum_epu64(counter_b);
    flag_counts[2] += avx512_sum_epu64(counter_c);
    flag_counts[3] += avx512_sum_epu64(counter_d);
    flag_counts[4] += avx512_sum_epu64(counter_e);
    flag_counts[5] += avx512_sum_epu64(counter_f);
    flag_counts[6] += avx512_sum_epu64(counter_g);
    flag_counts[7] += avx512_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*64), flag_counts);
}